

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

ALLEGRO_EVENT_QUEUE * al_create_event_queue(void)

{
  char *in_RAX;
  ALLEGRO_EVENT_QUEUE *vec;
  _AL_LIST_ITEM *p_Var1;
  ALLEGRO_EVENT_QUEUE *queue;
  size_t in_stack_00000008;
  _func_void_void_ptr *in_stack_00000010;
  void *in_stack_00000018;
  char *in_stack_00000020;
  _AL_DTOR_LIST *in_stack_00000028;
  
  vec = (ALLEGRO_EVENT_QUEUE *)
        al_malloc_with_context(in_stack_00000008,queue._4_4_,in_RAX,(char *)0x173f2e);
  if (vec != (ALLEGRO_EVENT_QUEUE *)0x0) {
    _al_vector_init((_AL_VECTOR *)vec,8);
    _al_vector_init(&vec->events,0x48);
    _al_vector_alloc_back(&vec->sources);
    vec->events_head = 0;
    vec->events_tail = 0;
    vec->paused = false;
    (vec->mutex).inited = false;
    _al_mutex_init((_AL_MUTEX *)0x173f9d);
    _al_cond_init((_AL_COND *)0x173fad);
    p_Var1 = _al_register_destructor
                       (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    vec->dtor_item = p_Var1;
  }
  return vec;
}

Assistant:

ALLEGRO_EVENT_QUEUE *al_create_event_queue(void)
{
   ALLEGRO_EVENT_QUEUE *queue = al_malloc(sizeof *queue);

   ASSERT(queue);

   if (queue) {
      _al_vector_init(&queue->sources, sizeof(ALLEGRO_EVENT_SOURCE *));

      _al_vector_init(&queue->events, sizeof(ALLEGRO_EVENT));
      _al_vector_alloc_back(&queue->events);
      queue->events_head = 0;
      queue->events_tail = 0;
      queue->paused = false;

      _AL_MARK_MUTEX_UNINITED(queue->mutex);
      _al_mutex_init(&queue->mutex);
      _al_cond_init(&queue->cond);

      queue->dtor_item = _al_register_destructor(_al_dtor_list, "queue", queue,
         (void (*)(void *)) al_destroy_event_queue);
   }

   return queue;
}